

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O0

undefined8 intgemm::PrintMatrix<signed_char>(char *mem,Index rows,Index cols)

{
  _Setw _Var1;
  ostream *poVar2;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  undefined8 in_RDI;
  Index c;
  Index r;
  ostringstream out;
  uint local_198;
  uint local_194;
  ostringstream local_190 [376];
  uint local_18;
  uint local_14;
  long local_10;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  for (local_194 = 0; local_194 < local_14; local_194 = local_194 + 1) {
    for (local_198 = 0; local_198 < local_18; local_198 = local_198 + 1) {
      _Var1 = Catch::clara::std::setw(4);
      poVar2 = std::operator<<((ostream *)local_190,(_Setw)_Var1._M_n);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,(long)*(char *)(local_10 +
                                                (ulong)(local_194 * local_18 + local_198)));
      std::operator<<(poVar2,' ');
    }
    std::operator<<((ostream *)local_190,'\n');
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string PrintMatrix(const Type *mem, Index rows, Index cols) {
  std::ostringstream out;
  for (Index r = 0; r < rows; ++r) {
    for (Index c = 0; c < cols; ++c) {
      out << std::setw(4) << (int64_t) mem[r * cols + c] << ' ';
    }
    out << '\n';
  }
  return out.str();
}